

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O0

Dar_Cut_t * Dar_ObjComputeCuts_rec(Dar_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Dar_Cut_t *pDVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pObj_local;
  Dar_Man_t *p_local;
  
  pDVar2 = Dar_ObjCuts(pObj);
  if (pDVar2 == (Dar_Cut_t *)0x0) {
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsBuf(pObj);
      if (iVar1 == 0) {
        pAVar3 = Aig_ObjFanin0(pObj);
        Dar_ObjComputeCuts_rec(p,pAVar3);
        pAVar3 = Aig_ObjFanin1(pObj);
        Dar_ObjComputeCuts_rec(p,pAVar3);
        p_local = (Dar_Man_t *)Dar_ObjComputeCuts(p,pObj,0);
      }
      else {
        pAVar3 = Aig_ObjFanin0(pObj);
        p_local = (Dar_Man_t *)Dar_ObjComputeCuts_rec(p,pAVar3);
      }
    }
    else {
      p_local = (Dar_Man_t *)Dar_ObjPrepareCuts(p,pObj);
    }
  }
  else {
    p_local = (Dar_Man_t *)Dar_ObjCuts(pObj);
  }
  return (Dar_Cut_t *)p_local;
}

Assistant:

Dar_Cut_t * Dar_ObjComputeCuts_rec( Dar_Man_t * p, Aig_Obj_t * pObj )
{
    if ( Dar_ObjCuts(pObj) )
        return Dar_ObjCuts(pObj);
    if ( Aig_ObjIsCi(pObj) )
        return Dar_ObjPrepareCuts( p, pObj );
    if ( Aig_ObjIsBuf(pObj) )
        return Dar_ObjComputeCuts_rec( p, Aig_ObjFanin0(pObj) );
    Dar_ObjComputeCuts_rec( p, Aig_ObjFanin0(pObj) );
    Dar_ObjComputeCuts_rec( p, Aig_ObjFanin1(pObj) );
    return Dar_ObjComputeCuts( p, pObj, 0 );
}